

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

int __thiscall branch_and_reduce_algorithm::cycleLowerBound(branch_and_reduce_algorithm *this)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pvVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int *piVar16;
  pointer piVar17;
  ulong uVar18;
  ulong uVar19;
  pointer piVar20;
  int iVar21;
  pointer piVar22;
  int iVar23;
  pointer piVar24;
  pointer piVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  uint local_f4;
  uint local_e4;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  ulong local_c8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  pointer local_68;
  
  iVar10 = this->crt;
  if (0 < this->n) {
    piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = 0;
    do {
      piVar3[lVar15] = -1;
      lVar15 = lVar15 + 1;
    } while (lVar15 < this->n);
  }
  iVar23 = this->n;
  if (0 < iVar23) {
    local_98 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar5 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a8 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_a0 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_90 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_88 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    uVar18 = 0;
    do {
      if ((piVar3[uVar18] < 0) && (piVar5[uVar18] < 0)) {
        piVar24 = (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar17 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = uVar18 & 0xffffffff;
        uVar19 = 0xffffffffffffffff;
        do {
          iVar23 = (int)uVar11;
          if (-1 < piVar5[iVar23]) {
            __assert_fail("id[v] < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x1c1,"int branch_and_reduce_algorithm::cycleLowerBound()");
          }
          piVar5[iVar23] = (int)uVar18;
          uVar1 = piVar24[iVar23];
          uVar11 = (ulong)uVar1;
          uVar12 = uVar19 + 1;
          iVar23 = (int)uVar12;
          piVar6[(int)uVar1] = iVar23;
          piVar17[uVar19 + 1] = uVar1;
          uVar19 = uVar12;
        } while (uVar18 != uVar11);
        bVar28 = true;
        uVar19 = 0;
        do {
          iVar2 = piVar17[uVar19];
          iVar21 = 0;
          for (piVar16 = pvVar4[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar16 !=
              *(pointer *)
               ((long)&pvVar4[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + 8); piVar16 = piVar16 + 1) {
            if (piVar3[*piVar16] < 0) {
              iVar21 = iVar21 + (uint)(piVar5[*piVar16] == piVar5[iVar2]);
            }
          }
          if (iVar21 != iVar23) {
            bVar28 = false;
            break;
          }
          bVar27 = uVar19 < (uVar12 & 0xffffffff);
          uVar19 = uVar19 + 1;
        } while (bVar27);
        if (bVar28) {
          iVar10 = iVar10 + iVar23;
        }
        else {
          pvVar7 = (this->adj).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68 = local_88;
          local_b0 = local_90;
          local_d8 = local_a0;
          local_d0 = local_a8;
          local_e0 = local_98;
          piVar24 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar1 = iVar23 + 1;
          do {
            uVar19 = (ulong)uVar1;
            uVar14 = uVar1;
            if ((int)uVar1 < 6) break;
            piVar17 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar20 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            local_e4 = 0;
            uVar11 = 0;
            local_f4 = uVar1;
            local_c8 = uVar19;
            do {
              iVar23 = (this->used).uid;
              (this->used).uid = iVar23 + 1;
              if (iVar23 < -1) {
                if (piVar20 != piVar17) {
                  uVar12 = 0;
                  do {
                    piVar17[uVar12] = 0;
                    uVar12 = uVar12 + 1;
                  } while ((uVar12 & 0xffffffff) < (ulong)((long)piVar20 - (long)piVar17 >> 2));
                }
                (this->used).uid = 1;
              }
              iVar23 = piVar24[uVar11];
              piVar16 = pvVar7[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar8 = *(pointer *)
                        ((long)&pvVar7[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data + 8);
              if (piVar16 != piVar8) {
                piVar22 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  iVar2 = *piVar16;
                  if ((piVar3[iVar2] < 0) && (piVar5[iVar2] == piVar5[iVar23])) {
                    piVar22[iVar2] = (this->used).uid;
                  }
                  piVar16 = piVar16 + 1;
                } while (piVar16 != piVar8);
              }
              uVar12 = uVar11 + 1;
              uVar26 = uVar12 & 0xffffffff;
              if (uVar12 == uVar19) {
                uVar26 = 0;
              }
              iVar23 = piVar24[uVar26];
              piVar16 = pvVar7[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar8 = *(pointer *)
                        ((long)&pvVar7[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data + 8);
              if (piVar16 != piVar8) {
                do {
                  iVar2 = *piVar16;
                  if ((piVar3[iVar2] < 0) && (piVar5[iVar2] == piVar5[iVar23])) {
                    uVar13 = (piVar6[iVar2] + 1) % (int)uVar1;
                    if ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[piVar24[(int)uVar13]] == (this->used).uid)
                    {
                      uVar9 = (long)(int)(piVar6[iVar2] + (uVar1 - (int)uVar11)) % (long)(int)uVar1;
                      if (((int)uVar9 < (int)(uint)local_c8) && ((uVar9 & 1) != 0)) {
                        local_c8 = uVar9 & 0xffffffff;
                        local_e4 = (uint)uVar26;
                        local_f4 = uVar13;
                      }
                    }
                  }
                  piVar16 = piVar16 + 1;
                } while (piVar16 != piVar8);
              }
              uVar11 = uVar12;
            } while (uVar12 != uVar19);
            uVar13 = uVar1 - (uint)local_c8;
            piVar17 = local_68;
            piVar20 = local_b0;
            piVar22 = local_e0;
            piVar25 = piVar24;
            if (uVar13 != 0) {
              lVar15 = 0;
              if (local_f4 != local_e4) {
                lVar15 = 0;
                uVar14 = local_f4;
                do {
                  local_e0[lVar15] = piVar24[(int)uVar14];
                  lVar15 = lVar15 + 1;
                  uVar14 = (int)(uVar14 + 1) % (int)uVar1;
                } while (uVar14 != local_e4);
              }
              for (; local_e4 != local_f4; local_e4 = (int)(local_e4 + 1) % (int)uVar1) {
                piVar5[piVar24[(int)local_e4]] = this->n;
              }
              (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = local_e0;
              (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = local_b0;
              (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_68;
              (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = piVar24;
              (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = local_d0;
              (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_d8;
              if (uVar13 != (uint)lVar15) {
                __assert_fail("size == p",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                              ,0x206,"int branch_and_reduce_algorithm::cycleLowerBound()");
              }
              if ((int)(uint)local_c8 < 2) {
                __assert_fail("minSize > 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                              ,0x207,"int branch_and_reduce_algorithm::cycleLowerBound()");
              }
              iVar10 = ((uint)local_c8 + 1 >> 1) + iVar10;
              piVar17 = local_d8;
              piVar20 = local_d0;
              piVar22 = piVar24;
              piVar25 = local_e0;
              uVar14 = uVar13;
              local_98 = piVar24;
              if ((int)uVar13 < 1) {
                local_88 = local_d8;
                local_90 = local_d0;
                local_a0 = local_68;
                local_a8 = local_b0;
                local_d0 = local_b0;
                local_d8 = local_68;
              }
              else {
                uVar19 = 0;
                do {
                  piVar6[local_e0[uVar19]] = (int)uVar19;
                  uVar19 = uVar19 + 1;
                } while (uVar13 != uVar19);
                local_88 = local_d8;
                local_90 = local_d0;
                local_a0 = local_68;
                local_a8 = local_b0;
                local_d0 = local_b0;
                local_d8 = local_68;
              }
            }
            bVar28 = uVar1 != (uint)local_c8;
            piVar24 = piVar25;
            uVar1 = uVar14;
            local_e0 = piVar22;
            local_b0 = piVar20;
            local_68 = piVar17;
          } while (bVar28);
          if ((int)uVar14 < 2) {
            __assert_fail("size > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x20c,"int branch_and_reduce_algorithm::cycleLowerBound()");
          }
          iVar10 = (uVar14 + 1 >> 1) + iVar10;
        }
      }
      uVar18 = uVar18 + 1;
      iVar23 = this->n;
    } while ((long)uVar18 < (long)iVar23);
  }
  piVar3 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (iVar23 * 2 != (int)((ulong)((long)piVar5 - (long)piVar3) >> 2)) {
    piVar24 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    piVar6 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar6;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = piVar3;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar5;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar24;
  }
  return iVar10;
}

Assistant:

int branch_and_reduce_algorithm::cycleLowerBound()
{
    int lb = crt;
    std::vector<int> &id = iter;
    for (int i = 0; i < n; i++)
        id[i] = -1;
    std::vector<int> &pos = que;
    std::vector<int> &S = level;
    std::vector<int> &S2 = modTmp;
    for (int i = 0; i < n; i++)
        if (x[i] < 0 && id[i] < 0)
        {
            int v = i;
            int size = 0;
            do
            {
                assert(id[v] < 0);
                id[v] = i;
                v = out[v];
                pos[v] = size;
                S[size++] = v;
            } while (v != i);
            bool clique = true;
            for (int j = 0; j < size; j++)
            {
                v = S[j];
                int num = 0;
                for (int u : adj[v])
                    if (x[u] < 0 && id[u] == id[v])
                        num++;
                if (num != size - 1)
                {
                    clique = false;
                    break;
                }
            }
            if (clique)
            {
                lb += size - 1;
            }
            else
            {
                while (size >= 6)
                {
                    int minSize = size, s = 0, t = size;
                    for (int j = 0; j < size; j++)
                    {
                        used.clear();
                        v = S[j];
                        for (int u : adj[v])
                            if (x[u] < 0 && id[u] == id[v])
                            {
                                used.add(u);
                            }
                        v = S[(j + 1) % size];
                        for (int u : adj[v])
                            if (x[u] < 0 && id[u] == id[v])
                            {
                                if (used.get(S[(pos[u] + 1) % size]))
                                {
                                    int size2 = (pos[u] - j + size) % size;
                                    if (minSize > size2 && size2 % 2 != 0)
                                    {
                                        minSize = size2;
                                        s = (j + 1) % size;
                                        t = (pos[u] + 1) % size;
                                    }
                                }
                            }
                    }
                    if (minSize == size)
                        break;
                    int p = 0;
                    for (int j = t; j != s; j = (j + 1) % size)
                    {
                        S2[p++] = S[j];
                    }
                    for (int j = s; j != t; j = (j + 1) % size)
                    {
                        id[S[j]] = n;
                    }

                    S.swap(S2);

                    size -= minSize;
                    assert(size == p);
                    assert(minSize > 1);
                    lb += (minSize + 1) / 2;
                    for (int j = 0; j < size; j++)
                        pos[S[j]] = j;
                }
                assert(size > 1);
                lb += (size + 1) / 2;
            }
        }

    if (static_cast<int>(level.size()) != n * 2)
    {
        level.swap(modTmp);
    }
    return lb;
}